

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall argo::lexer::read_number(lexer *this)

{
  int iVar1;
  size_t sVar2;
  token local_60;
  ulong local_30;
  size_t num_int_digits;
  size_t sStack_20;
  bool is_double;
  size_t n;
  lexer *plStack_10;
  int c;
  lexer *this_local;
  
  plStack_10 = this;
  n._4_4_ = (*this->m_reader->_vptr_reader[2])();
  sStack_20 = 0;
  num_int_digits._7_1_ = 0;
  local_30 = 0;
  iVar1 = isdigit(n._4_4_);
  if (iVar1 == 0) {
    if (n._4_4_ == 0x2d) {
      append_to_number_buffer(this,this->m_buffer,&stack0xffffffffffffffe0,0x2d);
    }
    else {
      throw_number_exception(this,n._4_4_);
    }
  }
  else {
    append_to_number_buffer(this,this->m_buffer,&stack0xffffffffffffffe0,n._4_4_);
    local_30 = local_30 + 1;
  }
  while( true ) {
    n._4_4_ = (*this->m_reader->_vptr_reader[2])();
    iVar1 = isdigit(n._4_4_);
    if (iVar1 == 0) break;
    append_to_number_buffer(this,this->m_buffer,&stack0xffffffffffffffe0,n._4_4_);
    local_30 = local_30 + 1;
  }
  (*this->m_reader->_vptr_reader[3])(this->m_reader,(ulong)n._4_4_);
  if (local_30 == 0) {
    throw_number_exception(this,n._4_4_);
  }
  else if ((1 < local_30) && (this->m_buffer[sStack_20 - local_30] == '0')) {
    throw_number_exception(this,0x30);
  }
  n._4_4_ = (*this->m_reader->_vptr_reader[2])();
  if (n._4_4_ == 0x2e) {
    append_to_number_buffer(this,this->m_buffer,&stack0xffffffffffffffe0,0x2e);
    num_int_digits._7_1_ = 1;
    sVar2 = read_digits(this,&stack0xffffffffffffffe0);
    if (sVar2 == 0) {
      throw_number_exception(this,n._4_4_);
    }
    n._4_4_ = (*this->m_reader->_vptr_reader[2])();
  }
  if ((n._4_4_ == 0x65) || (n._4_4_ == 0x45)) {
    append_to_number_buffer(this,this->m_buffer,&stack0xffffffffffffffe0,n._4_4_);
    num_int_digits._7_1_ = 1;
    n._4_4_ = (*this->m_reader->_vptr_reader[2])();
    if ((n._4_4_ == 0x2b) || (n._4_4_ == 0x2d)) {
      append_to_number_buffer(this,this->m_buffer,&stack0xffffffffffffffe0,n._4_4_);
      sVar2 = read_digits(this,&stack0xffffffffffffffe0);
      if (sVar2 == 0) {
        throw_number_exception(this,n._4_4_);
      }
    }
    else {
      throw_number_exception(this,n._4_4_);
    }
  }
  else {
    (*this->m_reader->_vptr_reader[3])(this->m_reader,(ulong)n._4_4_);
  }
  token::token(&local_60,num_int_digits._7_1_ & begin_object_e | number_int_e,this->m_buffer,
               sStack_20);
  token::operator=(&this->m_token,&local_60);
  token::~token(&local_60);
  return;
}

Assistant:

void lexer::read_number()
{
    int c = m_reader.next();

    size_t n = 0;
    bool is_double = false;
    size_t num_int_digits = 0;

    // - or digit
    if (isdigit(c))
    {
        append_to_number_buffer(m_buffer, n, c);
        num_int_digits++;
    }
    else if (c == '-')
    {
        append_to_number_buffer(m_buffer, n, c);
    }
    else
    {
        throw_number_exception(c);
    }

    // some digits
    while (true)
    {
        c = m_reader.next();

        if (isdigit(c))
        {
            append_to_number_buffer(m_buffer, n, c);
            num_int_digits++;
        }
        else
        {
            m_reader.put_back(c);
            break;
        }
    }

    if (num_int_digits == 0)
    {
        // Must be at least one digit in the buffer
        throw_number_exception(c);
    }
    else if (num_int_digits > 1 && m_buffer[n - num_int_digits] == '0')
    {
        // If there's more than one digit, the first one must not be zero. No leading zeroes
        // are allowed by the standard.
        throw_number_exception('0');
    }

    c = m_reader.next();

    // maybe followed by a point
    if (c == '.')
    {
        append_to_number_buffer(m_buffer, n, c);
        is_double = true;

        // followed by more digits
        if (read_digits(n) == 0)
        {
            throw_number_exception(c);
        }

        c = m_reader.next();
    }

    // e/E
    if (c == 'e' || c == 'E')
    {
        append_to_number_buffer(m_buffer, n, c);
        is_double = true;

        // +/-
        c = m_reader.next();

        if (c == '+' || c == '-')
        {
            append_to_number_buffer(m_buffer, n, c);

            // some digits
            if (read_digits(n) == 0)
            {
                throw_number_exception(c);
            }
        }
        else 
        {
            throw_number_exception(c);
        }
    }
    else
    {
        m_reader.put_back(c);
    }

    m_token = token(is_double ? token::number_double_e : token::number_int_e, m_buffer, n);
}